

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull.c
# Opt level: O2

void pull0_recv_cb(void *arg)

{
  nni_mtx *mtx;
  long lVar1;
  nng_err nVar2;
  uint32_t pid;
  int iVar3;
  nni_msg *m;
  void *pvVar4;
  nni_aio *pnVar5;
  size_t count;
  
  lVar1 = *(long *)((long)arg + 8);
  pnVar5 = (nni_aio *)((long)arg + 0x18);
  nVar2 = nni_aio_result(pnVar5);
  if (nVar2 != NNG_OK) {
    nni_pipe_close(*arg);
    return;
  }
  m = nni_aio_get_msg(pnVar5);
  nni_aio_set_msg(pnVar5,(nni_msg *)0x0);
  pid = nni_pipe_id(*arg);
  nni_msg_set_pipe(m,pid);
  mtx = (nni_mtx *)(lVar1 + 0x38);
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0x1e0) == '\x01') {
    nni_mtx_unlock(mtx);
    nni_msg_free(m);
    return;
  }
  iVar3 = nni_list_empty((nni_list *)(lVar1 + 0x20));
  if (iVar3 != 0) {
    nni_list_append((nni_list *)(lVar1 + 8),arg);
    pvVar4 = nni_list_first((nni_list *)(lVar1 + 8));
    if (pvVar4 == arg) {
      nni_pollable_raise((nni_pollable *)(lVar1 + 0x60));
    }
    *(nni_msg **)((long)arg + 0x10) = m;
    nni_mtx_unlock(mtx);
    return;
  }
  nni_pipe_recv(*arg,pnVar5);
  pnVar5 = (nni_aio *)nni_list_first((nni_list *)(lVar1 + 0x20));
  nni_aio_list_remove(pnVar5);
  nni_mtx_unlock(mtx);
  nni_aio_set_msg(pnVar5,m);
  count = nni_msg_len(m);
  nni_aio_finish_sync(pnVar5,NNG_OK,count);
  return;
}

Assistant:

static void
pull0_recv_cb(void *arg)
{
	pull0_pipe *p  = arg;
	pull0_sock *s  = p->s;
	nni_aio    *ap = &p->aio;
	nni_aio    *as;
	nni_msg    *m;

	if (nni_aio_result(ap) != 0) {
		// Failed to get a message, probably the pipe is closed.
		nni_pipe_close(p->p);
		return;
	}

	// Got a message... start the put to send it up to the application.
	m = nni_aio_get_msg(ap);
	nni_aio_set_msg(ap, NULL);
	nni_msg_set_pipe(m, nni_pipe_id(p->p));

	nni_mtx_lock(&s->m);
	if (p->closed) {
		nni_mtx_unlock(&s->m);
		nni_msg_free(m);
		return;
	}
	if (nni_list_empty(&s->rq)) {
		nni_list_append(&s->pl, p);
		if (nni_list_first(&s->pl) == p) {
			nni_pollable_raise(&s->readable);
		}
		p->m = m;
		nni_mtx_unlock(&s->m);
		return;
	}
	nni_pipe_recv(p->p, ap);
	as = nni_list_first(&s->rq);
	nni_aio_list_remove(as);
	nni_mtx_unlock(&s->m);
	nni_aio_set_msg(as, m);
	nni_aio_finish_sync(as, 0, nni_msg_len(m));
}